

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O2

boolean jtransform_perfect_transform
                  (JDIMENSION image_width,JDIMENSION image_height,int MCU_width,int MCU_height,
                  JXFORM_CODE transform)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = true;
  if (transform < JXFORM_WIPE) {
    if ((0x24U >> (transform & 0x1f) & 1) == 0) {
      if ((0x50U >> (transform & 0x1f) & 1) == 0) {
        if ((0x82U >> (transform & 0x1f) & 1) == 0) goto LAB_00111c50;
        uVar1 = image_width % (uint)MCU_width;
      }
      else {
        uVar1 = image_height % (uint)MCU_height | image_width % (uint)MCU_width;
      }
    }
    else {
      uVar1 = image_height % (uint)MCU_height;
    }
    bVar2 = uVar1 == 0;
  }
LAB_00111c50:
  return (boolean)bVar2;
}

Assistant:

GLOBAL(boolean)
jtransform_perfect_transform(JDIMENSION image_width, JDIMENSION image_height,
                             int MCU_width, int MCU_height,
                             JXFORM_CODE transform)
{
  boolean result = TRUE; /* initialize TRUE */

  switch (transform) {
  case JXFORM_FLIP_H:
  case JXFORM_ROT_270:
    if (image_width % (JDIMENSION)MCU_width)
      result = FALSE;
    break;
  case JXFORM_FLIP_V:
  case JXFORM_ROT_90:
    if (image_height % (JDIMENSION)MCU_height)
      result = FALSE;
    break;
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_180:
    if (image_width % (JDIMENSION)MCU_width)
      result = FALSE;
    if (image_height % (JDIMENSION)MCU_height)
      result = FALSE;
    break;
  default:
    break;
  }

  return result;
}